

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

bool __thiscall common::SettingsSpan::last_negated(SettingsSpan *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  if (this->size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return false;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    bVar1 = UniValue::isFalse(this->data + (this->size - 1));
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SettingsSpan::last_negated() const { return size > 0 && data[size - 1].isFalse(); }